

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterGreaterOrEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  ostringstream *this;
  TestLog *log;
  bool bVar1;
  qpTestResult qVar2;
  ResultCollector result;
  QueriedState state;
  ResultCollector local_238;
  QueriedState local_1e8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&local_1e8);
  log = gl->m_log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_238,log,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = gl->m_log;
  this = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying ",10);
  local_1c0.m_getName = glu::getTextureLevelParameterName;
  local_1c0.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", expecting ",0xc);
  std::ostream::operator<<(this,refValue);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," or greater",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            (&local_238,gl,type,target,level,pname,&local_1e8);
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&local_1e8);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyIntegerMin(&local_238,&local_1e8,refValue);
    qVar2 = tcu::ResultCollector::getResult(&local_238);
    bVar1 = qVar2 == QP_TEST_RESULT_PASS;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != &local_238.m_message.field_2) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    local_238.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_prefix._M_dataplus._M_p != &local_238.m_prefix.field_2) {
    operator_delete(local_238.m_prefix._M_dataplus._M_p,
                    local_238.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterGreaterOrEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	QueriedState			state;
	tcu::ResultCollector	result	(gl.getLog(), " // ERROR: ");

	gl.getLog() << tcu::TestLog::Message << "Verifying " << glu::getTextureLevelParameterStr(pname) << ", expecting " << refValue << " or greater" << tcu::TestLog::EndMessage;
	queryTextureLevelState(result, gl, type, target, level, pname, state);

	if (state.isUndefined())
		return false;

	verifyIntegerMin(result, state, refValue);

	return result.getResult() == QP_TEST_RESULT_PASS;
}